

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.h
# Opt level: O1

void __thiscall
assembler::asmcode::
add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,char_const(&)[16]>
          (asmcode *this,operation *val,operand *val_1,operand *val_2,char (*val_3) [16])

{
  operation oVar1;
  operand oVar2;
  operand oVar3;
  size_t sVar4;
  instruction ins;
  long *local_90 [2];
  long local_80 [2];
  instruction local_70;
  
  oVar1 = *val;
  oVar2 = *val_1;
  oVar3 = *val_2;
  local_90[0] = local_80;
  sVar4 = strlen(*val_3);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,val_3,*val_3 + sVar4);
  assembler::asmcode::instruction::instruction(&local_70,oVar1,oVar2,oVar3,(string *)local_90);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>::
  push_back((vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
             *)(*(long *)(*(long *)(this + 0x20) + -8) + 0x10),&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.text._M_dataplus._M_p != &local_70.text.field_2) {
    operator_delete(local_70.text._M_dataplus._M_p,local_70.text.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void add(T&&... val)
      {
      instruction ins(std::forward<T>(val)...);
      (*instructions_list_stack.back()).push_back(ins);
      }